

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall FValueTextItem::MenuEvent(FValueTextItem *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  FSoundID local_28;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  FValueTextItem *pFStack_18;
  int mkey_local;
  FValueTextItem *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pFStack_18 = this;
  uVar1 = TArray<FString,_FString>::Size(&this->mSelections);
  if (1 < uVar1) {
    if (local_1c == 2) {
      FSoundID::FSoundID(&local_24,"menu/change");
      fVar3 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_24,fVar3,0.0);
      iVar2 = this->mSelection + -1;
      this->mSelection = iVar2;
      if (iVar2 < 0) {
        uVar1 = TArray<FString,_FString>::Size(&this->mSelections);
        this->mSelection = uVar1 - 1;
      }
      return true;
    }
    if ((local_1c == 3) || (local_1c == 6)) {
      FSoundID::FSoundID(&local_28,"menu/change");
      fVar3 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_28,fVar3,0.0);
      iVar2 = this->mSelection + 1;
      this->mSelection = iVar2;
      uVar1 = TArray<FString,_FString>::Size(&this->mSelections);
      if ((int)uVar1 <= iVar2) {
        this->mSelection = 0;
      }
      return true;
    }
  }
  return local_1c == 6;
}

Assistant:

bool FValueTextItem::MenuEvent (int mkey, bool fromcontroller)
{
	if (mSelections.Size() > 1)
	{
		if (mkey == MKEY_Left)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
			if (--mSelection < 0) mSelection = mSelections.Size() - 1;
			return true;
		}
		else if (mkey == MKEY_Right || mkey == MKEY_Enter)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
			if (++mSelection >= (int)mSelections.Size()) mSelection = 0;
			return true;
		}
	}
	return (mkey == MKEY_Enter);	// needs to eat enter keys so that Activate won't get called
}